

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

void __thiscall QPDFObjectHandle::replaceDict(QPDFObjectHandle *this,QPDFObjectHandle *new_dict)

{
  QPDFObjectHandle local_28;
  QPDFObjectHandle *local_18;
  QPDFObjectHandle *new_dict_local;
  QPDFObjectHandle *this_local;
  
  local_18 = new_dict;
  new_dict_local = this;
  as_stream(&local_28,(typed)this);
  ::qpdf::Stream::replaceDict((Stream *)&local_28,local_18);
  ::qpdf::Stream::~Stream((Stream *)&local_28);
  return;
}

Assistant:

void
QPDFObjectHandle::replaceDict(QPDFObjectHandle const& new_dict)
{
    as_stream(error).replaceDict(new_dict);
}